

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::recoveredgebyflips
          (tetgenmesh *this,point startpt,point endpt,face *sedge,triface *searchtet,int fullsearch)

{
  tetrahedron ppdVar1;
  tetrahedron endpt_00;
  tetrahedron ppdVar2;
  tetrahedron ppdVar3;
  tetrahedron *pppdVar4;
  bool bVar5;
  bool bVar6;
  interresult iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  interresult iVar11;
  tetrahedron *pppdVar12;
  ulong uVar13;
  tetrahedron *pppdVar14;
  uint uVar15;
  int *piVar16;
  ulong uVar17;
  int types [2];
  int poss [4];
  flipconstraints local_a8;
  
  local_a8.fac[0] = (point)0x0;
  local_a8.remvert = (point)0x0;
  local_a8.enqflag = 0;
  local_a8.chkencflag = 0;
  local_a8.unflip = 0;
  local_a8.collectnewtets = 0;
  local_a8.collectencsegflag = 0;
  local_a8.remove_ndelaunay_edge = 0;
  local_a8.bak_tetprism_vol._0_4_ = 0;
  local_a8.bak_tetprism_vol._4_4_ = 0;
  local_a8.tetprism_vol_sum._0_4_ = 0;
  local_a8._36_8_ = 0;
  local_a8.cosdihed_in = 0.0;
  local_a8.cosdihed_out = 0.0;
  local_a8.checkflipeligibility = 1;
  local_a8.seg[0] = startpt;
  local_a8.seg[1] = endpt;
LAB_00134c39:
  do {
    pppdVar12 = (tetrahedron *)((ulong)startpt[this->point2simindex] & 0xfffffffffffffff0);
    searchtet->tet = pppdVar12;
    if (pppdVar12[4] == (tetrahedron)startpt) {
      iVar8 = 0xb;
    }
    else if (pppdVar12[5] == (tetrahedron)startpt) {
      iVar8 = 3;
    }
    else {
      iVar8 = 0;
      if (pppdVar12[6] == (tetrahedron)startpt) {
        iVar8 = 7;
      }
    }
    searchtet->ver = iVar8;
    iVar7 = finddirection(this,searchtet,endpt);
    if (iVar7 == ACROSSVERT) {
      if (searchtet->tet[destpivot[searchtet->ver]] == (tetrahedron)endpt) {
        return 1;
      }
      if (sedge == (face *)0x0) {
        return 0;
      }
      iVar7 = ACROSSVERT;
      goto LAB_00135325;
    }
    uVar9 = enextesymtbl[searchtet->ver];
    searchtet->ver = uVar9;
    if (iVar7 == ACROSSFACE) {
      if (((this->checksubfaceflag != 0) && (searchtet->tet[9] != (tetrahedron)0x0)) &&
         (searchtet->tet[9][uVar9 & 3] != (double *)0x0)) {
        if (sedge == (face *)0x0) {
          return 0;
        }
        iVar7 = ACROSSFACE;
        goto LAB_00135325;
      }
      iVar8 = removefacebyflips(this,searchtet,&local_a8);
      if (iVar8 == 0) goto LAB_00134d2a;
    }
    else {
      if (((this->checksubsegflag != 0) && (searchtet->tet[8] != (tetrahedron)0x0)) &&
         (searchtet->tet[8][ver2edge[(int)uVar9]] != (double *)0x0)) {
        if (sedge != (face *)0x0) {
          iVar7 = ACROSSEDGE;
LAB_00135325:
          report_selfint_edge(this,startpt,endpt,sedge,searchtet,iVar7);
        }
        return 0;
      }
      iVar8 = removeedgebyflips(this,searchtet,&local_a8);
      if (iVar8 != 2) {
LAB_00134d2a:
        if (fullsearch == 0) {
          return 0;
        }
        pppdVar12 = (tetrahedron *)((ulong)startpt[this->point2simindex] & 0xfffffffffffffff0);
        searchtet->tet = pppdVar12;
        if (pppdVar12[4] == (tetrahedron)startpt) {
          iVar8 = 0xb;
        }
        else if (pppdVar12[5] == (tetrahedron)startpt) {
          iVar8 = 3;
        }
        else {
          iVar8 = 0;
          if (pppdVar12[6] == (tetrahedron)startpt) {
            iVar8 = 7;
          }
        }
        searchtet->ver = iVar8;
        iVar7 = finddirection(this,searchtet,endpt);
        uVar17 = (ulong)(uint)enextesymtbl[searchtet->ver];
        pppdVar12 = searchtet->tet;
LAB_00134dab:
        ppdVar1 = pppdVar12[(uint)uVar17 & 3];
        uVar9 = (uint)ppdVar1 & 0xf;
        searchtet->ver = uVar9;
        pppdVar12 = (tetrahedron *)((ulong)ppdVar1 & 0xfffffffffffffff0);
        searchtet->tet = pppdVar12;
        uVar9 = fsymtbl[(int)(uint)uVar17][uVar9];
        searchtet->ver = uVar9;
        if (iVar7 != ACROSSFACE) {
          if (iVar7 == ACROSSEDGE) {
            bVar5 = true;
LAB_00134df9:
            piVar16 = eprevesymtbl;
            if (bVar5) {
              piVar16 = enextesymtbl;
            }
            uVar17 = (ulong)piVar16[searchtet->ver];
            pppdVar12 = searchtet->tet;
            iVar8 = tri_edge_test(this,(point)pppdVar12[orgpivot[uVar17]],
                                  (point)pppdVar12[destpivot[uVar17]],
                                  (point)pppdVar12[apexpivot[uVar17]],startpt,endpt,
                                  (point)pppdVar12[oppopivot[uVar17]],1,types,poss);
            if (iVar8 == 0) break;
            if (types[0] == 0) goto LAB_00134e9a;
            goto LAB_00134f76;
          }
LAB_001352b3:
          puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
          puts("  the message above, your input data set, and the exact");
          puts("  command line you used to run this program, thank you.");
          exit(2);
        }
        iVar8 = 1;
        while( true ) {
          uVar15 = (uVar9 & 3) + iVar8 & 3;
          uVar17 = (ulong)uVar15;
          uVar13 = (ulong)(uVar15 * 4);
          iVar10 = tri_edge_test(this,(point)pppdVar12[*(int *)((long)orgpivot + uVar13)],
                                 (point)pppdVar12[*(int *)((long)destpivot + uVar13)],
                                 (point)pppdVar12[*(int *)((long)apexpivot + uVar13)],startpt,endpt,
                                 (point)pppdVar12[*(int *)((long)oppopivot + uVar13)],1,types,poss);
          if (iVar10 != 0) break;
          iVar8 = iVar8 + 1;
          if (iVar8 == 4) goto LAB_001352b3;
        }
        if (types[0] == 0) goto LAB_001352b3;
LAB_00134f76:
        iVar7 = types[0];
        uVar9 = (uint)uVar17;
        iVar8 = poss[0];
        if (0 < poss[0]) {
          do {
            uVar9 = enexttbl[(int)uVar17];
            uVar17 = (ulong)uVar9;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        if (types[0] == 2) {
          if (pppdVar12[orgpivot[(int)uVar9]] == (tetrahedron)endpt) {
            return 0;
          }
          goto LAB_001352b3;
        }
        searchtet->tet = pppdVar12;
        searchtet->ver = uVar9;
        ppdVar1 = pppdVar12[orgpivot[(int)uVar9]];
        endpt_00 = pppdVar12[destpivot[(int)uVar9]];
        ppdVar2 = pppdVar12[apexpivot[(int)uVar9]];
        ppdVar3 = pppdVar12[oppopivot[(int)uVar9]];
        if (types[0] == 8) {
          if (((this->checksubsegflag != 0) && (pppdVar12[8] != (tetrahedron)0x0)) &&
             (pppdVar12[8][ver2edge[(int)uVar9]] != (double *)0x0)) {
            if (sedge == (face *)0x0) {
              return 0;
            }
            iVar7 = ACROSSEDGE;
LAB_00135379:
            report_selfint_edge(this,startpt,endpt,sedge,searchtet,iVar7);
            return 0;
          }
          iVar8 = removeedgebyflips(this,searchtet,&local_a8);
          if (iVar8 == 2) goto LAB_00134c39;
        }
        else {
          if (types[0] != 9) {
            if ((types[0] == 7) && (sedge == (face *)0x0)) {
              return 0;
            }
            goto LAB_001352b3;
          }
          if (((this->checksubfaceflag != 0) && (pppdVar12[9] != (tetrahedron)0x0)) &&
             (pppdVar12[9][uVar9 & 3] != (double *)0x0)) {
            if (sedge == (face *)0x0) {
              return 0;
            }
            iVar7 = ACROSSFACE;
            goto LAB_00135379;
          }
          iVar8 = removefacebyflips(this,searchtet,&local_a8);
          if (iVar8 != 0) goto LAB_00134c39;
        }
        pppdVar12 = searchtet->tet;
        if (pppdVar12 != (tetrahedron *)0x0) goto code_r0x00135095;
        goto LAB_001350e8;
      }
    }
  } while( true );
  bVar6 = !bVar5;
  bVar5 = false;
  if (bVar6) {
LAB_00134e9a:
    iVar8 = searchtet->ver;
    ppdVar1 = searchtet->tet[facepivot1[iVar8]];
    uVar9 = (uint)ppdVar1 & 0xf;
    searchtet->ver = uVar9;
    searchtet->tet = (tetrahedron *)((ulong)ppdVar1 & 0xfffffffffffffff0);
    searchtet->ver = facepivot2[iVar8][uVar9];
    bVar5 = true;
  }
  goto LAB_00134df9;
code_r0x00135095:
  uVar9 = searchtet->ver;
  uVar17 = (ulong)uVar9;
  if (((pppdVar12[orgpivot[(int)uVar9]] != ppdVar1) ||
      (pppdVar12[destpivot[(int)uVar9]] != endpt_00)) ||
     ((pppdVar12[apexpivot[(int)uVar9]] != ppdVar2 || (pppdVar12[oppopivot[(int)uVar9]] != ppdVar3))
     )) {
LAB_001350e8:
    pppdVar12 = (tetrahedron *)((ulong)ppdVar1[this->point2simindex] & 0xfffffffffffffff0);
    searchtet->tet = pppdVar12;
    if (pppdVar12[4] == ppdVar1) {
      iVar8 = 0xb;
    }
    else if (pppdVar12[5] == ppdVar1) {
      iVar8 = 3;
    }
    else {
      iVar8 = 0;
      if (pppdVar12[6] == ppdVar1) {
        iVar8 = 7;
      }
    }
    searchtet->ver = iVar8;
    iVar11 = finddirection(this,searchtet,(point)endpt_00);
    if (iVar11 == ACROSSVERT) {
      pppdVar4 = searchtet->tet;
      uVar17 = (ulong)searchtet->ver;
      pppdVar12 = pppdVar4;
      if (pppdVar4[destpivot[uVar17]] == endpt_00) {
        while( true ) {
          uVar9 = (uint)uVar17;
          if (pppdVar12[apexpivot[(int)uVar9]] == ppdVar2) break;
          pppdVar14 = (tetrahedron *)((ulong)pppdVar12[facepivot1[(int)uVar9]] & 0xfffffffffffffff0)
          ;
          uVar17 = (ulong)(uint)facepivot2[(int)uVar9]
                                [(uint)pppdVar12[facepivot1[(int)uVar9]] & 0xf];
          pppdVar12 = pppdVar14;
          if (pppdVar4 == pppdVar14) goto LAB_00135232;
        }
        searchtet->tet = pppdVar12;
        searchtet->ver = uVar9;
        if (pppdVar12[oppopivot[(int)uVar9]] == ppdVar3) goto LAB_00134dab;
        ppdVar1 = pppdVar12[uVar9 & 3];
        uVar15 = (uint)ppdVar1 & 0xf;
        searchtet->ver = uVar15;
        pppdVar12 = (tetrahedron *)((ulong)ppdVar1 & 0xfffffffffffffff0);
        searchtet->tet = pppdVar12;
        uVar17 = (ulong)fsymtbl[(int)uVar9][uVar15];
        searchtet->ver = fsymtbl[(int)uVar9][uVar15];
        if (pppdVar12[oppopivot[uVar17]] == ppdVar3) goto LAB_00134dab;
      }
    }
LAB_00135232:
    searchtet->tet = (tetrahedron *)0x0;
    return 0;
  }
  goto LAB_00134dab;
}

Assistant:

int tetgenmesh::recoveredgebyflips(point startpt, point endpt, face *sedge,
                                   triface* searchtet, int fullsearch)
{
  flipconstraints fc;
  enum interresult dir;

  fc.seg[0] = startpt;
  fc.seg[1] = endpt;
  fc.checkflipeligibility = 1;

  // The mainloop of the edge reocvery.
  while (1) { // Loop I

    // Search the edge from 'startpt'.
    point2tetorg(startpt, *searchtet);
    dir = finddirection(searchtet, endpt);
    if (dir == ACROSSVERT) {
      if (dest(*searchtet) == endpt) {
        return 1; // Edge is recovered.
      } else {
        if (sedge) {
          return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
        } else {
          return 0;
        }
      }
    }

    // The edge is missing. 

    // Try to remove the first intersecting face/edge.
    enextesymself(*searchtet); // Go to the opposite face.
    if (dir == ACROSSFACE) {
      if (checksubfaceflag) {
        if (issubface(*searchtet)) {
          if (sedge) {
            return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
          } else {
            return 0; // Cannot flip a subface.
          }
        }
      }
      // Try to flip a crossing face.
      if (removefacebyflips(searchtet, &fc)) {
        continue;
      }
    } else if (dir == ACROSSEDGE) {
      if (checksubsegflag) {
        if (issubseg(*searchtet)) {
          if (sedge) {
            return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
          } else {
            return 0; // Cannot flip a segment.
          }
        }
      }
      // Try to flip an intersecting edge.
      if (removeedgebyflips(searchtet, &fc) == 2) {
        continue;
      }
    }

    // The edge is missing.

    if (fullsearch) {
      // Try to flip one of the faces/edges which intersects the edge.
      triface neightet, spintet;
      point pa, pb, pc, pd;
      badface bakface;
      enum interresult dir1;
      int types[2], poss[4], pos = 0;
      int success = 0;
      int t1ver; 
      int i, j;

      // Loop through the sequence of intersecting faces/edges from
      //   'startpt' to 'endpt'.
      point2tetorg(startpt, *searchtet);
      dir = finddirection(searchtet, endpt);

      // Go to the face/edge intersecting the searching edge.
      enextesymself(*searchtet); // Go to the opposite face.
      // This face/edge has been tried in previous step.

      while (1) { // Loop I-I

        // Find the next intersecting face/edge.
        fsymself(*searchtet);
        if (dir == ACROSSFACE) {
          neightet = *searchtet;
          j = (neightet.ver & 3); // j is the current face number.
          for (i = j + 1; i < j + 4; i++) {
            neightet.ver = (i % 4);
            pa = org(neightet);
            pb = dest(neightet);
            pc = apex(neightet);
            pd = oppo(neightet); // The above point.
            if (tri_edge_test(pa,pb,pc,startpt,endpt, pd, 1, types, poss)) {
              dir = (enum interresult) types[0];
              pos = poss[0];
              break;
            } else {
              dir = DISJOINT;
              pos = 0;
            }
          } // i
          // There must be an intersection face/edge.
          if (dir == DISJOINT) {
            terminatetetgen(this, 2);
          }
        } else if (dir == ACROSSEDGE) {
          while (1) { // Loop I-I-I
            // Check the two opposite faces (of the edge) in 'searchtet'.  
            for (i = 0; i < 2; i++) {
              if (i == 0) {
                enextesym(*searchtet, neightet);
              } else {
                eprevesym(*searchtet, neightet);
              }
              pa = org(neightet);
              pb = dest(neightet);
              pc = apex(neightet);
              pd = oppo(neightet); // The above point.
              if (tri_edge_test(pa,pb,pc,startpt,endpt,pd,1, types, poss)) {
                dir = (enum interresult) types[0];
                pos = poss[0];
                break; // for loop
              } else {
                dir = DISJOINT;
                pos = 0;
              }
            } // i
            if (dir != DISJOINT) {
              // Find an intersection face/edge.
              break;  // Loop I-I-I
            }
            // No intersection. Rotate to the next tet at the edge.
            fnextself(*searchtet);
          } // while (1) // Loop I-I-I
        } else {
          terminatetetgen(this, 2); // Report a bug
        }

        // Adjust to the intersecting edge/vertex.
        for (i = 0; i < pos; i++) {
          enextself(neightet);
        }

        if (dir == SHAREVERT) {
          // Check if we have reached the 'endpt'.
          pd = org(neightet);
          if (pd == endpt) {
            // Failed to recover the edge.
            break; // Loop I-I
          } else {
            terminatetetgen(this, 2); // Report a bug
          }
        }

        // The next to be flipped face/edge.
        *searchtet = neightet;

        // Bakup this face (tetrahedron).
        bakface.forg = org(*searchtet);
        bakface.fdest = dest(*searchtet);
        bakface.fapex = apex(*searchtet);
        bakface.foppo = oppo(*searchtet);

        // Try to flip this intersecting face/edge.
        if (dir == ACROSSFACE) {
          if (checksubfaceflag) {
            if (issubface(*searchtet)) {
              if (sedge) {
                return report_selfint_edge(startpt,endpt,sedge,searchtet,dir);
              } else {
                return 0; // Cannot flip a subface.
              }
            }
          }
          if (removefacebyflips(searchtet, &fc)) {
            success = 1;
            break; // Loop I-I 
          }
        } else if (dir == ACROSSEDGE) {
          if (checksubsegflag) {
            if (issubseg(*searchtet)) {
              if (sedge) {
                return report_selfint_edge(startpt,endpt,sedge,searchtet,dir);
              } else {
                return 0; // Cannot flip a segment.
              }
            }
          }
          if (removeedgebyflips(searchtet, &fc) == 2) {
            success = 1;
            break; // Loop I-I
          }
        } else if (dir == ACROSSVERT) {
          if (sedge) {
            //return report_selfint_edge(startpt, endpt, sedge, searchtet, dir);
            terminatetetgen(this, 2);
          } else {
            return 0;
          }
        } else {
          terminatetetgen(this, 2); 
        }

        // The face/edge is not flipped.
        if ((searchtet->tet == NULL) ||
            (org(*searchtet) != bakface.forg) ||
            (dest(*searchtet) != bakface.fdest) ||
            (apex(*searchtet) != bakface.fapex) ||
            (oppo(*searchtet) != bakface.foppo)) {
          // 'searchtet' was flipped. We must restore it.
          point2tetorg(bakface.forg, *searchtet);
          dir1 = finddirection(searchtet, bakface.fdest);
          if (dir1 == ACROSSVERT) {
            if (dest(*searchtet) == bakface.fdest) {
              spintet = *searchtet;
              while (1) {
                if (apex(spintet) == bakface.fapex) {
                  // Found the face.
                  *searchtet = spintet;
                  break;
                }
                fnextself(spintet);
                if (spintet.tet == searchtet->tet) {
                  searchtet->tet = NULL;
                  break; // Not find.
                }
	          } // while (1)
              if (searchtet->tet != NULL) {
                if (oppo(*searchtet) != bakface.foppo) {
                  fsymself(*searchtet);
                  if (oppo(*searchtet) != bakface.foppo) {
                    // The original (intersecting) tet has been flipped.
                    searchtet->tet = NULL;
                    break; // Not find.
                  }
                }
              }
            } else {
              searchtet->tet = NULL; // Not find.
            }
          } else {
            searchtet->tet = NULL; // Not find.
          }
          if (searchtet->tet == NULL) {
            success = 0; // This face/edge has been destroyed.
            break; // Loop I-I 
          }
        }
      } // while (1) // Loop I-I

      if (success) {
        // One of intersecting faces/edges is flipped.
        continue;
      }

    } // if (fullsearch)

    // The edge is missing.
    break; // Loop I

  } // while (1) // Loop I

  return 0;
}